

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O2

void __thiscall wasm::OptimizeInstructions::visitArraySet(OptimizeInstructions *this,ArraySet *curr)

{
  Expression **input;
  bool bVar1;
  uint bytes;
  undefined1 local_38 [8];
  optional<wasm::Field> field;
  
  input = &curr->ref;
  skipNonNullCast(this,input,(Expression *)curr);
  bVar1 = trapOnNull(this,(Expression *)curr,input);
  if ((!bVar1) && (((curr->value->type).id & 0xfffffffffffffffe) == 2)) {
    GCTypeUtils::getField((optional<wasm::Field> *)local_38,(Type)((*input)->type).id,0);
    if (field.super__Optional_base<wasm::Field,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Field>._M_payload.field2[8] == '\x01') {
      bytes = Field::getByteSize((Field *)local_38);
      optimizeStoredValue(this,&curr->value,bytes);
    }
  }
  return;
}

Assistant:

void visitArraySet(ArraySet* curr) {
    skipNonNullCast(curr->ref, curr);
    if (trapOnNull(curr, curr->ref)) {
      return;
    }

    if (curr->value->type.isInteger()) {
      if (auto field = GCTypeUtils::getField(curr->ref->type)) {
        optimizeStoredValue(curr->value, field->getByteSize());
      }
    }
  }